

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetFont(ON_DimStyle *this,ON_Font *font_characteristics)

{
  bool bVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ON_Font *pOVar5;
  undefined1 auStack_38 [16];
  
  pOVar5 = ON_Font::ManagedFont(font_characteristics);
  if (pOVar5 == (ON_Font *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0xda7,"","ON_Font::GetManagedFont(font_characteristics) failed.");
    return;
  }
  bVar3 = true;
  if (this->m_managed_font == pOVar5) {
    iVar4 = ON_Font::CompareFontCharacteristics(font_characteristics,&this->m_font_characteristics);
    if (iVar4 == 0) {
      ON_Font::Description((ON_Font *)(auStack_38 + 8));
      ON_Font::Description((ON_Font *)auStack_38);
      bVar3 = ::operator!=((ON_wString *)(auStack_38 + 8),(ON_wString *)auStack_38);
      bVar1 = true;
      goto LAB_0045237c;
    }
  }
  bVar1 = false;
LAB_0045237c:
  if (bVar1) {
    ON_wString::~ON_wString((ON_wString *)auStack_38);
    ON_wString::~ON_wString((ON_wString *)(auStack_38 + 8));
  }
  ON_Font::operator=(&this->m_font_characteristics,font_characteristics);
  if (bVar3 != false) {
    this->m_managed_font = pOVar5;
    uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_text_position_properties_hash).m_digest =
         ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_text_position_properties_hash).m_digest + 8) = uVar2;
    *(undefined4 *)((this->m_text_position_properties_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar2;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,Font);
  return;
}

Assistant:

void ON_DimStyle::SetFont(
  const ON_Font& font_characteristics
)
{
  const ON_Font* managed_font = font_characteristics.ManagedFont();
  if (nullptr == managed_font)
  {
    ON_ERROR("ON_Font::GetManagedFont(font_characteristics) failed.");
    return;
  }

  const bool bManagedFontChanged = (m_managed_font != managed_font);

  const bool bFontChanged
    = bManagedFontChanged
    || (0 != ON_Font::CompareFontCharacteristics(font_characteristics, m_font_characteristics))
    || m_font_characteristics.Description() != font_characteristics.Description()
    ;

  // copy font_characteristics unconditionally in case compare missed some detail.
  m_font_characteristics = font_characteristics;

  if (bFontChanged)
  {
    m_managed_font = managed_font;
    Internal_TextPositionPropertiesChange();
  }

  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::Font);
}